

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3io.c
# Opt level: O3

int bio_fread_intv_3d(void ****arr,size_t e_sz,uint32 s,uint32 e,uint32 *d1,uint32 *d2,uint32 *d3,
                     FILE *fp,uint32 swap,uint32 *chksum)

{
  uint32 uVar1;
  int32 iVar2;
  int iVar3;
  uint uVar4;
  void *buf;
  void ***pppvVar5;
  char *pcVar6;
  long lVar7;
  uint uVar8;
  uint n_el;
  uint32 l_d1;
  uint local_58;
  uint local_54;
  uint32 local_50;
  uint local_4c;
  void ****local_48;
  uint *local_40;
  uint32 *local_38;
  
  local_38 = d2;
  iVar2 = bio_fread(&local_4c,4,1,fp,swap,chksum);
  if (iVar2 == 1) {
    local_50 = s;
    local_48 = arr;
    local_40 = d1;
    if ((local_4c <= s) || (local_4c <= e)) {
      if (local_4c <= s) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
                ,0x15d,"Start, %u, is outside the interval [0 %u]\n",(ulong)s,(ulong)(local_4c - 1))
        ;
      }
      if (local_4c <= e) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
                ,0x161,"End, %u, is outside the interval [0 %u]\n",(ulong)e,(ulong)(local_4c - 1));
      }
      exit(-1);
    }
    iVar2 = bio_fread(&local_54,4,1,fp,swap,chksum);
    if (iVar2 == 1) {
      iVar2 = bio_fread(&local_58,4,1,fp,swap,chksum);
      uVar1 = local_50;
      if (iVar2 == 1) {
        iVar3 = fseek((FILE *)fp,(local_54 * local_50 * local_58) * e_sz + 4,1);
        if (iVar3 < 0) {
          pcVar6 = "Can\'t seek in file";
          lVar7 = 0x180;
        }
        else {
          uVar8 = (e - uVar1) + 1;
          n_el = local_54 * uVar8 * local_58;
          buf = __ckd_calloc__((ulong)n_el,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
                               ,0x184);
          uVar4 = bio_fread(buf,(int32)e_sz,n_el,fp,swap,chksum);
          if (uVar4 == n_el) {
            pppvVar5 = (void ***)
                       __ckd_alloc_3d_ptr((ulong)uVar8,(ulong)local_54,(ulong)local_58,buf,e_sz,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
                                          ,0x189);
            *local_48 = pppvVar5;
            *local_40 = uVar8;
            *local_38 = local_54;
            *d3 = local_58;
            return 0;
          }
          pcVar6 = "Can\'t read";
          lVar7 = 0x186;
        }
        err_msg_system(ERR_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
                       ,lVar7,pcVar6);
        exit(1);
      }
      if (iVar2 == 0) {
        pcVar6 = "Unable to read complete data";
        lVar7 = 0x174;
      }
      else {
        pcVar6 = "OS error in bio_fread_3d";
        lVar7 = 0x177;
      }
    }
    else if (iVar2 == 0) {
      pcVar6 = "Unable to read complete data";
      lVar7 = 0x16a;
    }
    else {
      pcVar6 = "OS error in bio_fread_3d";
      lVar7 = 0x16d;
    }
  }
  else if (iVar2 == 0) {
    pcVar6 = "Unable to read complete data";
    lVar7 = 0x152;
  }
  else {
    pcVar6 = "OS error in bio_fread_3d";
    lVar7 = 0x155;
  }
  err_msg_system(ERR_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
                 ,lVar7,pcVar6);
  return -1;
}

Assistant:

int
bio_fread_intv_3d(void ****arr,
	       size_t e_sz,
	       uint32 s,
	       uint32 e,
	       uint32 *d1,
	       uint32 *d2,
	       uint32 *d3,
	       FILE *fp,
	       uint32 swap,
	       uint32 *chksum)
{
    uint32 l_d1;
    uint32 l_d2;
    uint32 l_d3;
    uint32 s_d1;
    uint32 n;
    void *raw;
    size_t ret;

    ret = bio_fread(&l_d1, sizeof(uint32), 1, fp, swap, chksum);
    if (ret != 1) {
	if (ret == 0) {
	    E_ERROR_SYSTEM("Unable to read complete data");
	}
	else {
	    E_ERROR_SYSTEM("OS error in bio_fread_3d");
	}
	return S3_ERROR;
    }

    if ((s >= l_d1) || (e >= l_d1)) {
	if (s >= l_d1) {
	    E_ERROR("Start, %u, is outside the interval [0 %u]\n",
		    s, l_d1-1);
	}
	if (e >= l_d1) {
	    E_ERROR("End, %u, is outside the interval [0 %u]\n",
		    e, l_d1-1);
	}
	
	exit(-1);
    }

    ret = bio_fread(&l_d2, sizeof(uint32), 1, fp, swap, chksum);
    if (ret != 1) {
	if (ret == 0) {
	    E_ERROR_SYSTEM("Unable to read complete data");
	}
	else {
	    E_ERROR_SYSTEM("OS error in bio_fread_3d");
	}
	return S3_ERROR;
    }
    ret = bio_fread(&l_d3, sizeof(uint32), 1, fp, swap, chksum);
    if (ret != 1) {
	if (ret == 0) {
	    E_ERROR_SYSTEM("Unable to read complete data");
	}
	else {
	    E_ERROR_SYSTEM("OS error in bio_fread_3d");
	}
	return S3_ERROR;
    }

    /* # of rows in subinterval */
    s_d1 = e - s + 1;
    
    if (fseek(fp, (long)(s*l_d2*l_d3*e_sz + sizeof(uint32)), SEEK_CUR) < 0) {
	E_FATAL_SYSTEM("Can't seek in file");
    }

    n = s_d1 * l_d2 * l_d3;
    raw = ckd_calloc(n, sizeof(float32));
    if (bio_fread(raw, e_sz, n, fp, swap, chksum) != n) {
	E_FATAL_SYSTEM("Can't read");
    }

    *arr = ckd_alloc_3d_ptr(s_d1, l_d2, l_d3, raw, e_sz);

    *d1 = s_d1;
    *d2 = l_d2;
    *d3 = l_d3;
    
    return S3_SUCCESS;
}